

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::crn_comp::level_details>::clear
          (vector<crnlib::crn_comp::level_details> *this)

{
  vector<crnlib::crn_comp::level_details> *this_local;
  
  if (this->m_p != (level_details *)0x0) {
    scalar_type<crnlib::crn_comp::level_details>::destruct_array(this->m_p,this->m_size);
    crnlib_free(this->m_p);
    this->m_p = (level_details *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnlib_free(m_p);
                m_p = nullptr;
                m_size = 0;
                m_capacity = 0;
            }
        }